

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rate2.cpp
# Opt level: O1

STAmount * jbcoin::detail::as_amount(STAmount *__return_storage_ptr__,Rate *rate)

{
  uint uVar1;
  undefined8 uVar2;
  
  if (noIssue()::issue == '\0') {
    as_amount();
  }
  uVar1 = rate->value;
  (__return_storage_ptr__->super_STBase).fName = (SField *)sfGeneric;
  (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6f40;
  uVar2 = noIssue()::issue._8_8_;
  *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn = noIssue()::issue._0_8_;
  *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) = uVar2;
  uVar2 = noIssue()::issue._24_8_;
  *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = noIssue()::issue._16_8_;
  *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) = uVar2;
  *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) = noIssue()::issue._32_8_;
  __return_storage_ptr__->mValue = (ulong)uVar1;
  __return_storage_ptr__->mOffset = -9;
  __return_storage_ptr__->mIsNegative = false;
  STAmount::canonicalize(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

STAmount as_amount (Rate const& rate)
{
    return { noIssue(), rate.value, -9, false };
}